

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfileio.hpp
# Opt level: O3

bool __thiscall
soplex::
SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::readBasisFile(SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this,char *filename,NameSet *rowNames,NameSet *colNames)

{
  int iVar1;
  undefined1 uVar2;
  spxifstream file;
  allocator local_359;
  string local_358;
  undefined1 local_338 [536];
  ios_base local_120 [264];
  
  std::__cxx11::string::string((string *)&local_358,filename,&local_359);
  zstr::ifstream::ifstream((ifstream *)local_338,&local_358,_S_in,0x100000);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_358._M_dataplus._M_p != &local_358.field_2) {
    operator_delete(local_358._M_dataplus._M_p,local_358.field_2._M_allocated_capacity + 1);
  }
  if (((byte)(*(_func_int **)(local_338._0_8_ + -0x18))[(long)(local_338 + 0x20)] & 5) == 0) {
    iVar1 = (*(this->
              super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              )._vptr_SPxBasisBase[1])
                      (&this->
                        super_SPxBasisBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ,local_338,rowNames,colNames);
    uVar2 = (undefined1)iVar1;
  }
  else {
    uVar2 = 0;
  }
  zstr::ifstream::~ifstream((ifstream *)local_338,&zstr::ifstream::VTT);
  std::ios_base::~ios_base((ios_base *)(local_338 + 0x218));
  return (bool)uVar2;
}

Assistant:

bool SPxSolverBase<R>::readBasisFile(
   const char*    filename,
   const NameSet* rowNames,
   const NameSet* colNames)
{
   spxifstream file(filename);

   if(!file)
      return false;

   return this->readBasis(file, rowNames, colNames);
}